

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::AppendToBuffer(FlowBuffer *this,const_byteptr data,int len)

{
  if (0 < len) {
    ExpandBuffer(this,this->buffer_n_ + len);
    memcpy(this->buffer_ + this->buffer_n_,data,(ulong)(uint)len);
    this->buffer_n_ = this->buffer_n_ + len;
    this->orig_data_begin_ = this->orig_data_begin_ + (uint)len;
  }
  return;
}

Assistant:

void FlowBuffer::AppendToBuffer(const_byteptr data, int len)
	{
	if ( len <= 0 )
		return;

	BINPAC_ASSERT(! chunked_);
	ExpandBuffer(buffer_n_ + len);
	memcpy(buffer_ + buffer_n_, data, len);
	buffer_n_ += len;

	orig_data_begin_ += len;
	BINPAC_ASSERT(orig_data_begin_ <= orig_data_end_);
	}